

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O0

void __thiscall
TEST_MockStrictOrderTest_OrderObserved_TestShell::~TEST_MockStrictOrderTest_OrderObserved_TestShell
          (TEST_MockStrictOrderTest_OrderObserved_TestShell *this)

{
  TEST_MockStrictOrderTest_OrderObserved_TestShell *this_local;
  
  ~TEST_MockStrictOrderTest_OrderObserved_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockStrictOrderTest, OrderObserved)
{
    mock().strictOrder();

    mock().expectOneCall("foo1");
    mock().expectOneCall("foo2");
    mock().actualCall("foo1");
    mock().actualCall("foo2");

    mock().checkExpectations();
}